

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_des.cc
# Opt level: O3

int des_ede_ecb_cipher(EVP_CIPHER_CTX *ctx,uint8_t *out,uint8_t *in,size_t in_len)

{
  DES_key_schedule *ks1;
  ulong uVar1;
  size_t i;
  ulong uVar2;
  
  uVar1 = (ulong)ctx->cipher->block_size;
  if (uVar1 <= in_len) {
    ks1 = (DES_key_schedule *)ctx->cipher_data;
    uVar2 = 0;
    do {
      DES_ecb3_encrypt_ex(in + uVar2,out + uVar2,ks1,ks1 + 1,ks1 + 2,ctx->encrypt);
      uVar2 = uVar2 + ctx->cipher->block_size;
    } while (uVar2 <= in_len - uVar1);
  }
  return 1;
}

Assistant:

static int des_ede_ecb_cipher(EVP_CIPHER_CTX *ctx, uint8_t *out,
                              const uint8_t *in, size_t in_len) {
  if (in_len < ctx->cipher->block_size) {
    return 1;
  }
  in_len -= ctx->cipher->block_size;

  DES_EDE_KEY *dat = (DES_EDE_KEY *)ctx->cipher_data;
  for (size_t i = 0; i <= in_len; i += ctx->cipher->block_size) {
    DES_ecb3_encrypt_ex(in + i, out + i, &dat->ks.ks[0], &dat->ks.ks[1],
                        &dat->ks.ks[2], ctx->encrypt);
  }
  return 1;
}